

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

StatelessGenerator<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>
cppqc::arrayOf<ArbitraryTestsFixtures::UserDefinedType,2ul>
          (StatelessGenerator<ArbitraryTestsFixtures::UserDefinedType> *g)

{
  __uniq_ptr_impl<cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>_>_>
  in_RDI;
  StatelessGenerator<ArbitraryTestsFixtures::UserDefinedType> *in_stack_ffffffffffffffb8;
  ArrayOfStatelessGenerator<ArbitraryTestsFixtures::UserDefinedType,_2UL> *in_stack_ffffffffffffffd8
  ;
  StatelessGenerator<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>
  *in_stack_ffffffffffffffe0;
  
  detail::ArrayOfStatelessGenerator<ArbitraryTestsFixtures::UserDefinedType,_2UL>::
  ArrayOfStatelessGenerator
            ((ArrayOfStatelessGenerator<ArbitraryTestsFixtures::UserDefinedType,_2UL> *)
             in_RDI._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>_>_>
             .
             super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>_*,_false>
             ._M_head_impl,in_stack_ffffffffffffffb8);
  StatelessGenerator<std::array<ArbitraryTestsFixtures::UserDefinedType,2ul>>::
  StatelessGenerator<cppqc::detail::ArrayOfStatelessGenerator<ArbitraryTestsFixtures::UserDefinedType,2ul>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  detail::ArrayOfStatelessGenerator<ArbitraryTestsFixtures::UserDefinedType,_2UL>::
  ~ArrayOfStatelessGenerator
            ((ArrayOfStatelessGenerator<ArbitraryTestsFixtures::UserDefinedType,_2UL> *)0x3da1aa);
  return (unique_ptr<cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>_>_>
          )(unique_ptr<cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>_>_>
            )in_RDI._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>_>_>
             .
             super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>_*,_false>
             ._M_head_impl;
}

Assistant:

StatelessGenerator<std::array<T, N>> arrayOf(
    const StatelessGenerator<T>& g = Arbitrary<T>()) {
  return detail::ArrayOfStatelessGenerator<T, N>(g);
}